

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall Assimp::XFileParser::ParseDataObjectMeshVertexColors(XFileParser *this,Mesh *pMesh)

{
  pointer paVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  aiColor4D aVar7;
  allocator<char> local_59;
  string local_58;
  
  readHeadOfDataObject(this,(string *)0x0);
  uVar3 = pMesh->mNumColorSets;
  uVar4 = uVar3 + 1;
  if (8 < uVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Too many colorsets",&local_59);
    ThrowException(this,&local_58);
  }
  pMesh->mNumColorSets = uVar4;
  uVar4 = ReadInt(this);
  if (((long)(pMesh->mPositions).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)(pMesh->mPositions).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start) / 0xc == (ulong)uVar4) {
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0x3f80000000000000;
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
              (pMesh->mColors + uVar3,(ulong)uVar4,(value_type *)&local_58);
    while( true ) {
      bVar6 = uVar4 == 0;
      uVar4 = uVar4 - 1;
      if (bVar6) {
        CheckForClosingBrace(this);
        return;
      }
      uVar5 = ReadInt(this);
      if ((ulong)(((long)(pMesh->mPositions).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pMesh->mPositions).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0xc) <= (ulong)uVar5) break;
      aVar7 = ReadRGBA(this);
      paVar1 = pMesh->mColors[uVar3].
               super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start + uVar5;
      paVar1->r = aVar7.r;
      paVar1->g = aVar7.g;
      paVar1->b = aVar7.b;
      paVar1->a = aVar7.a;
      if (this->mIsBinaryFormat == false) {
        FindNextNoneWhiteSpace(this);
        cVar2 = *this->mP;
        if ((cVar2 == ';') || (cVar2 == ',')) {
          this->mP = this->mP + 1;
        }
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Vertex color index out of bounds",&local_59);
    ThrowException(this,&local_58);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Vertex color count does not match vertex count",&local_59);
  ThrowException(this,&local_58);
}

Assistant:

void XFileParser::ParseDataObjectMeshVertexColors( Mesh* pMesh)
{
    readHeadOfDataObject();
    if( pMesh->mNumColorSets + 1 > AI_MAX_NUMBER_OF_COLOR_SETS)
        ThrowException( "Too many colorsets");
    std::vector<aiColor4D>& colors = pMesh->mColors[pMesh->mNumColorSets++];

    unsigned int numColors = ReadInt();
    if( numColors != pMesh->mPositions.size())
        ThrowException( "Vertex color count does not match vertex count");

    colors.resize( numColors, aiColor4D( 0, 0, 0, 1));
    for( unsigned int a = 0; a < numColors; a++)
    {
        unsigned int index = ReadInt();
        if( index >= pMesh->mPositions.size())
            ThrowException( "Vertex color index out of bounds");

        colors[index] = ReadRGBA();
        // HACK: (thom) Maxon Cinema XPort plugin puts a third separator here, kwxPort puts a comma.
        // Ignore gracefully.
        if( !mIsBinaryFormat)
        {
            FindNextNoneWhiteSpace();
            if( *mP == ';' || *mP == ',')
                mP++;
        }
    }

    CheckForClosingBrace();
}